

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O1

void rt_Translate1col(BYTE *translation,int hx,int yl,int yh)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = (yh - yl) + 1;
  pbVar2 = dc_temp + (hx + yl * 4);
  if (7 < uVar5) {
    iVar4 = (int)uVar5 >> 3;
    do {
      bVar1 = translation[pbVar2[4]];
      *pbVar2 = translation[*pbVar2];
      pbVar2[4] = bVar1;
      bVar1 = translation[pbVar2[0xc]];
      pbVar2[8] = translation[pbVar2[8]];
      pbVar2[0xc] = bVar1;
      bVar1 = translation[pbVar2[0x14]];
      pbVar2[0x10] = translation[pbVar2[0x10]];
      pbVar2[0x14] = bVar1;
      bVar1 = translation[pbVar2[0x1c]];
      pbVar2[0x18] = translation[pbVar2[0x18]];
      pbVar2[0x1c] = bVar1;
      pbVar2 = pbVar2 + 0x20;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if ((uVar5 & 7) != 0) {
    lVar3 = 0;
    do {
      pbVar2[lVar3 * 4] = translation[pbVar2[lVar3 * 4]];
      lVar3 = lVar3 + 1;
    } while (((byte)(((char)yh - (char)yl) + 1) & 7) != (uint)lVar3);
  }
  return;
}

Assistant:

void rt_Translate1col(const BYTE *translation, int hx, int yl, int yh)
{
	int count = yh - yl + 1;
	BYTE *source = &dc_temp[yl*4 + hx];

	// Things we do to hit the compiler's optimizer with a clue bat:
	// 1. Parallelism is explicitly spelled out by using a separate
	//    C instruction for each assembly instruction. GCC lets me
	//    have four temporaries, but VC++ spills to the stack with
	//    more than two. Two is probably optimal, anyway.
	// 2. The results of the translation lookups are explicitly
	//    stored in byte-sized variables. This causes the VC++ code
	//    to use byte mov instructions in most cases; for apparently
	//    random reasons, it will use movzx for some places. GCC
	//    ignores this and uses movzx always.

	// Do 8 rows at a time.
	for (int count8 = count >> 3; count8; --count8)
	{
		int c0, c1;
		BYTE b0, b1;

		c0 = source[0];			c1 = source[4];
		b0 = translation[c0];	b1 = translation[c1];
		source[0] = b0;			source[4] = b1;

		c0 = source[8];			c1 = source[12];
		b0 = translation[c0];	b1 = translation[c1];
		source[8] = b0;			source[12] = b1;

		c0 = source[16];		c1 = source[20];
		b0 = translation[c0];	b1 = translation[c1];
		source[16] = b0;		source[20] = b1;

		c0 = source[24];		c1 = source[28];
		b0 = translation[c0];	b1 = translation[c1];
		source[24] = b0;		source[28] = b1;

		source += 32;
	}
	// Finish by doing 1 row at a time.
	for (count &= 7; count; --count, source += 4)
	{
		source[0] = translation[source[0]];
	}
}